

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-room.c
# Opt level: O1

_Bool build_template(chunk *c,loc_conflict centre,wchar_t rating)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  char cVar4;
  _Bool _Var5;
  uint32_t uVar6;
  square *psVar7;
  loc_conflict lVar8;
  loc_conflict lVar9;
  loc_conflict grid_00;
  wchar_t wVar10;
  wchar_t wVar11;
  room_template *prVar12;
  char *pcVar13;
  char *pcVar14;
  wchar_t wVar15;
  room_template *prVar16;
  uint32_t uVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  char *pcVar21;
  loc_conflict grid;
  _Bool reflect;
  wchar_t txmax;
  wchar_t rotate;
  wchar_t tymax;
  loc local_a8;
  _Bool local_99;
  ulong local_98;
  loc_conflict local_90;
  wchar_t local_84;
  wchar_t local_80;
  wchar_t local_7c;
  int local_78;
  wchar_t local_74;
  ulong local_70;
  char *local_68;
  char *local_60;
  uint local_58;
  wchar_t local_54;
  long local_50;
  room_template *local_48;
  bitflag *local_40;
  char *local_38;
  
  uVar17 = 1;
  prVar16 = (room_template *)0x0;
  prVar12 = room_templates;
  do {
    if ((prVar12->typ == '\x01') && ((uint)prVar12->rat == rating)) {
      uVar6 = Rand_div(uVar17);
      if (uVar6 == 0) {
        prVar16 = prVar12;
      }
      uVar17 = uVar17 + 1;
    }
    prVar12 = prVar12->next;
  } while (prVar12 != (room_template *)0x0);
  if (prVar16 == (room_template *)0x0) {
LAB_00157903:
    _Var5 = false;
  }
  else {
    event_signal_string(EVENT_GEN_ROOM_CHOOSE_SUBTYPE,prVar16->name);
    bVar1 = prVar16->hgt;
    wVar11 = (wchar_t)bVar1;
    bVar2 = prVar16->wid;
    bVar3 = prVar16->dor;
    local_60 = prVar16->text;
    local_54 = (wchar_t)prVar16->tval;
    local_90 = centre;
    if (c == (chunk *)0x0) {
      __assert_fail("c",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                    ,0x480,
                    "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                   );
    }
    local_7c = c->depth;
    uVar17 = Rand_div(0x19);
    local_70 = CONCAT44(local_70._4_4_,uVar17);
    local_84 = Rand_div((uint)bVar3);
    uVar17 = Rand_div(2);
    local_68 = (char *)CONCAT44(local_68._4_4_,uVar17);
    local_98 = (ulong)bVar2;
    if ((local_90.y < c->height) && (local_90.x < c->width)) {
      get_random_symmetry_transform
                (wVar11,(uint)bVar2,L'\0',L'\0',&local_74,&local_99,(int *)&local_58,&local_78);
      iVar18 = (int)local_98;
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_58 + L'\x02',local_78 + L'\x02');
      if ((local_58 != bVar1) || (local_78 != iVar18)) {
        __assert_fail("tymax == ymax && txmax == xmax",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                      ,0x49b,
                      "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                     );
      }
    }
    else {
      wVar15 = calc_default_transpose_weight(wVar11,(uint)bVar2);
      get_random_symmetry_transform
                (wVar11,(wchar_t)local_98,L'\0',wVar15,&local_74,&local_99,(int *)&local_58,
                 &local_78);
      event_signal_size(EVENT_GEN_ROOM_CHOOSE_SIZE,local_58 + L'\x02',local_78 + L'\x02');
      iVar18 = (int)local_98;
      _Var5 = find_space(&local_90,local_58 + L'\x02',local_78 + L'\x02');
      if (!_Var5) goto LAB_00157903;
    }
    local_90.y = local_90.y - (int)local_58 / 2;
    local_90.x = local_90.x - local_78 / 2;
    if (wVar11 != L'\0') {
      local_40 = prVar16->flags;
      local_70 = CONCAT44(local_70._4_4_,(wchar_t)local_70 + 1);
      local_84 = local_84 + L'1';
      local_50 = (ulong)(iVar18 - 1) + 1;
      wVar15 = L'\0';
      pcVar13 = local_60;
      pcVar21 = local_60;
      local_80 = wVar11;
      local_48 = prVar16;
      do {
        if (*pcVar13 == '\0') break;
        pcVar14 = pcVar13;
        if (local_98 != 0) {
          local_38 = pcVar13 + local_50;
          lVar20 = 0;
          do {
            if (pcVar13[lVar20] == '\0') {
              pcVar14 = pcVar13 + lVar20;
              pcVar21 = local_60;
              break;
            }
            local_a8 = (loc)loc((int)lVar20,wVar15);
            symmetry_transform((loc_conflict *)&local_a8,local_90.y,local_90.x,local_80,
                               (wchar_t)local_98,local_74,local_99);
            if (pcVar13[lVar20] != ' ') {
              square_set_feat((chunk_conflict *)c,local_a8,FEAT_FLOOR);
              _Var5 = square_isempty((chunk_conflict *)c,local_a8);
              if (!_Var5) {
                __assert_fail("square_isempty(c, grid)",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x4b2,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              bVar1 = pcVar13[lVar20];
              wVar10 = local_a8.x;
              wVar11 = local_a8.y;
              if (bVar1 < 0x5b) {
                switch(bVar1) {
                case 0x23:
switchD_001572cd_caseD_23:
                  square_set_feat((chunk_conflict *)c,local_a8,FEAT_GRANITE);
                  generate_mark(c,wVar11,wVar10,wVar11,wVar10,L'\r');
                  break;
                case 0x25:
                  square_set_feat((chunk_conflict *)c,local_a8,FEAT_GRANITE);
                  generate_mark(c,wVar11,wVar10,wVar11,wVar10,L'\f');
                  _Var5 = flag_has_dbg(local_40,1,1,"flags","ROOMF_FEW_ENTRANCES");
                  if (_Var5) {
                    append_entrance((loc_conflict)local_a8);
                  }
                  break;
                case 0x28:
                  if ((int)local_68 == 0) {
                    place_secret_door((chunk_conflict *)c,(loc_conflict)local_a8);
                  }
                  break;
                case 0x29:
                  if ((int)local_68 != 0) goto LAB_001573c2;
LAB_001572e1:
                  square_set_feat((chunk_conflict *)c,local_a8,FEAT_GRANITE);
                  generate_mark(c,wVar11,wVar10,wVar11,wVar10,L'\r');
                  break;
                case 0x2b:
                  place_closed_door((chunk_conflict *)c,(loc_conflict)local_a8);
                  break;
                case 0x31:
                case 0x32:
                case 0x33:
                case 0x34:
                case 0x35:
                case 0x36:
                  if (local_84 != (char)bVar1) goto LAB_001572e1;
LAB_001573c2:
                  place_secret_door((chunk_conflict *)c,(loc_conflict)local_a8);
                  break;
                case 0x38:
                  uVar17 = Rand_div(100);
                  if (((int)uVar17 < 0x50) || (dun->persist == true)) {
                    wVar11 = c->depth;
                    wVar10 = L'\0';
                    goto LAB_001574f6;
                  }
                  place_random_stairs((chunk_conflict *)c,(loc_conflict)local_a8);
                }
              }
              else if (bVar1 == 0x5b) {
                wVar11 = c->depth;
                wVar10 = local_54;
LAB_001574f6:
                place_object((chunk_conflict *)c,(loc_conflict)local_a8,wVar11,false,false,'\x03',
                             wVar10);
              }
              else if (bVar1 == 0x5e) {
                uVar17 = Rand_div(4);
                if (uVar17 == 0) {
                  place_trap(c,local_a8,L'\xffffffff',c->depth);
                }
              }
              else if ((bVar1 == 0x78) && ((int)local_68 == 0)) goto switchD_001572cd_caseD_23;
              psVar7 = square((chunk_conflict *)c,local_a8);
              flag_on_dbg(psVar7->info,3,4,"square(c, grid)->info","SQUARE_ROOM");
              if (local_7c <= (wchar_t)local_70) {
                psVar7 = square((chunk_conflict *)c,local_a8);
                flag_on_dbg(psVar7->info,3,2,"square(c, grid)->info","SQUARE_GLOW");
              }
            }
            lVar20 = lVar20 + 1;
            pcVar14 = local_38;
            pcVar21 = local_60;
          } while (iVar18 != (int)lVar20);
        }
        wVar15 = wVar15 + L'\x01';
        pcVar13 = pcVar14;
      } while (wVar15 != local_80);
      local_7c = local_90.x;
      local_84 = local_90.y;
      local_70 = 0;
      prVar16 = local_48;
      uVar19 = local_98;
      wVar11 = local_80;
      do {
        if (*pcVar21 == '\0') break;
        if (uVar19 != 0) {
          local_68 = pcVar21 + local_50;
          lVar20 = 0;
          local_60 = pcVar21;
          do {
            pcVar13 = local_60;
            if (local_60[lVar20] == '\0') {
              pcVar21 = local_60 + lVar20;
              break;
            }
            local_a8 = (loc)loc((int)lVar20,(int)local_70);
            symmetry_transform((loc_conflict *)&local_a8,local_84,local_7c,wVar11,(wchar_t)uVar19,
                               local_74,local_99);
            cVar4 = pcVar13[lVar20];
            if (cVar4 == '9') {
              lVar8 = loc(2,-2);
              lVar9 = loc(3,3);
              _Var5 = square_isroom((chunk_conflict *)c,local_a8);
              if ((!_Var5) || (_Var5 = square_isfloor((chunk_conflict *)c,local_a8), !_Var5)) {
                __assert_fail("square_isroom(c, grid) && square_isfloor(c, grid)",
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x538,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              grid_00 = loc_diff((loc_conflict)local_a8,lVar9);
              wVar11 = c->depth;
              uVar17 = Rand_div(2);
              uVar6 = Rand_div(2);
              vault_monsters((chunk_conflict *)c,grid_00,wVar11 + uVar17,uVar6 + L'\x01');
              lVar9 = loc_sum((loc_conflict)local_a8,lVar9);
              wVar11 = c->depth;
              uVar17 = Rand_div(2);
              uVar6 = Rand_div(2);
              vault_monsters((chunk_conflict *)c,lVar9,wVar11 + uVar17,uVar6 + L'\x01');
              uVar17 = Rand_div(2);
              if (uVar17 == 0) {
                lVar9 = loc_sum((loc_conflict)local_a8,lVar8);
                wVar11 = c->depth;
                uVar17 = Rand_div(2);
                vault_objects((chunk_conflict *)c,lVar9,wVar11,uVar17 + L'\x01');
              }
              uVar17 = Rand_div(2);
              prVar16 = local_48;
              wVar11 = local_80;
              uVar19 = local_98;
              if (uVar17 == 0) {
                lVar8 = loc_diff((loc_conflict)local_a8,lVar8);
                wVar15 = c->depth;
                uVar17 = Rand_div(2);
                uVar19 = local_98;
                vault_objects((chunk_conflict *)c,lVar8,wVar15,uVar17 + L'\x01');
              }
            }
            else if (cVar4 == '8') {
              _Var5 = square_isroom((chunk_conflict *)c,local_a8);
              if ((!_Var5) ||
                 ((_Var5 = square_isfloor((chunk_conflict *)c,local_a8), !_Var5 &&
                  (_Var5 = square_isstairs((chunk_conflict *)c,local_a8), !_Var5)))) {
                __assert_fail("square_isroom(c, grid) && (square_isfloor(c, grid) || square_isstairs(c, grid))"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x52a,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              wVar15 = c->depth;
              uVar17 = Rand_div(2);
              vault_monsters((chunk_conflict *)c,(loc_conflict)local_a8,wVar15 + L'\x02',
                             uVar17 + L'\x03');
            }
            else if (cVar4 == '#') {
              _Var5 = square_isroom((chunk_conflict *)c,local_a8);
              if ((!_Var5) || (_Var5 = square_isgranite((chunk_conflict *)c,local_a8), !_Var5)) {
LAB_00157919:
                __assert_fail("square_isroom(c, grid) && square_isgranite(c, grid) && sqinfo_has(square(c, grid)->info, SQUARE_WALL_SOLID)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/gen-room.c"
                              ,0x518,
                              "_Bool build_room_template(struct chunk *, struct loc, int, int, int, const char *, int, const bitflag *)"
                             );
              }
              psVar7 = square((chunk_conflict *)c,local_a8);
              _Var5 = flag_has_dbg(psVar7->info,3,0xd,"square(c, grid)->info","SQUARE_WALL_SOLID");
              if (!_Var5) goto LAB_00157919;
              wVar15 = count_neighbors((loc *)0x0,(chunk_conflict *)c,local_a8,square_isroom,false);
              if (wVar15 == L'\b') {
                psVar7 = square((chunk_conflict *)c,local_a8);
                flag_off(psVar7->info,3,0xd);
                psVar7 = square((chunk_conflict *)c,local_a8);
                flag_on_dbg(psVar7->info,3,0xb,"square(c, grid)->info","SQUARE_WALL_INNER");
              }
            }
            lVar20 = lVar20 + 1;
            pcVar21 = local_68;
          } while ((int)uVar19 != (int)lVar20);
        }
        wVar15 = (int)local_70 + L'\x01';
        local_70 = (ulong)(uint)wVar15;
      } while (wVar15 != wVar11);
    }
    _Var5 = true;
    if ((player->opts).opt[0x18] == true) {
      msg("Room template (%s)",prVar16->name);
    }
  }
  return _Var5;
}

Assistant:

bool build_template(struct chunk *c, struct loc centre, int rating)
{
	/* All room templates currently have type 1 */
	return build_room_template_type(c, centre, 1, rating);
}